

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O1

MetaDataList * __thiscall
QFactoryLoader::metaData(MetaDataList *__return_storage_ptr__,QFactoryLoader *this)

{
  QMutex *this_00;
  __pointer_type copy;
  pointer puVar1;
  qsizetype qVar2;
  long lVar3;
  unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter> *library;
  pointer puVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QLatin1StringView s;
  char *local_c8;
  QCborValue local_88;
  QCborValue local_70;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QPluginParsedMetaData *)0x0;
  (__return_storage_ptr__->d).size = 0;
  this_00 = &(this->d).mutex;
  if ((this->d).mutex.super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar5 = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar5) {
      (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (bVar5) goto LAB_002d8892;
  }
  QBasicMutex::lockInternal(&this_00->super_QBasicMutex);
LAB_002d8892:
  puVar1 = (this->d).libraries.
           super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar4 = (this->d).libraries.
                super__Vector_base<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>,_std::allocator<std::unique_ptr<QLibraryPrivate,_QLibraryPrivate::Deleter>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar4 != puVar1; puVar4 = puVar4 + 1) {
    QtPrivate::QGenericArrayOps<QPluginParsedMetaData>::emplace<QPluginParsedMetaData_const&>
              ((QGenericArrayOps<QPluginParsedMetaData> *)__return_storage_ptr__,
               (__return_storage_ptr__->d).size,
               &((puVar4->_M_t).super___uniq_ptr_impl<QLibraryPrivate,_QLibraryPrivate::Deleter>.
                 _M_t.super__Tuple_impl<0UL,_QLibraryPrivate_*,_QLibraryPrivate::Deleter>.
                 super__Head_base<0UL,_QLibraryPrivate_*,_false>._M_head_impl)->metaData);
    QList<QPluginParsedMetaData>::end(__return_storage_ptr__);
  }
  local_c8 = (this->d).iid.d.ptr;
  if (local_c8 == (char *)0x0) {
    local_c8 = "";
  }
  qVar2 = (this->d).iid.d.size;
  QPluginLoader::staticPlugins();
  lVar3 = 0;
  do {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
    QPluginParsedMetaData::QPluginParsedMetaData
              ((QPluginParsedMetaData *)&local_58,*(QByteArrayView *)(&DAT_aaaaaaaaaaaaaab2 + lVar3)
              );
    bVar5 = true;
    if ((int)local_48 == 0xa0) {
      QCborValue::operator[](&local_70,(QCborValue *)&local_58,2);
      s.m_data = local_c8;
      s.m_size = qVar2;
      QCborValue::QCborValue((QCborValue *)&local_88,s);
      bVar5 = ::comparesEqual(&local_70,&local_88);
      bVar5 = !bVar5;
      QCborValue::~QCborValue((QCborValue *)&local_88);
      QCborValue::~QCborValue((QCborValue *)&local_70);
    }
    if (!bVar5) {
      QtPrivate::QGenericArrayOps<QPluginParsedMetaData>::emplace<QPluginParsedMetaData>
                ((QGenericArrayOps<QPluginParsedMetaData> *)__return_storage_ptr__,
                 (__return_storage_ptr__->d).size,(QPluginParsedMetaData *)&local_58);
      QList<QPluginParsedMetaData>::end(__return_storage_ptr__);
    }
    QCborValue::~QCborValue((QCborValue *)&local_58);
    lVar3 = lVar3 + 0x18;
  } while (lVar3 != -0x10);
  LOCK();
  _DAT_aaaaaaaaaaaaaaaa = _DAT_aaaaaaaaaaaaaaaa + -1;
  UNLOCK();
  if (_DAT_aaaaaaaaaaaaaaaa == 0) {
    QArrayData::deallocate((QArrayData *)&DAT_aaaaaaaaaaaaaaaa,0x18,0x10);
  }
  LOCK();
  copy = (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p;
  (this_00->super_QBasicMutex).d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(&this_00->super_QBasicMutex,copy);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QFactoryLoader::MetaDataList QFactoryLoader::metaData() const
{
    QList<QPluginParsedMetaData> metaData;
#if QT_CONFIG(library)
    QMutexLocker locker(&d->mutex);
    for (const auto &library : d->libraries)
        metaData.append(library->metaData);
#endif

    QLatin1StringView iid(d->iid.constData(), d->iid.size());
    const auto staticPlugins = QPluginLoader::staticPlugins();
    for (const QStaticPlugin &plugin : staticPlugins) {
        QByteArrayView pluginData(static_cast<const char *>(plugin.rawMetaData), plugin.rawMetaDataSize);
        QPluginParsedMetaData parsed(pluginData);
        if (parsed.isError() || parsed.value(QtPluginMetaDataKeys::IID) != iid)
            continue;
        metaData.append(std::move(parsed));
    }

    // other portions of the code will cast to int (e.g., keyMap())
    Q_ASSERT(metaData.size() <= std::numeric_limits<int>::max());
    return metaData;
}